

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

StringRef llvm::dwarf::EndianityString(uint Endian)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SVar3;
  
  sVar2 = 0;
  pcVar1 = (char *)0x0;
  if ((int)Endian < 2) {
    if (Endian == 0) {
      sVar2 = 0xe;
      pcVar1 = "DW_END_default";
    }
    else if (Endian == 1) {
      sVar2 = 10;
      pcVar1 = "DW_END_big";
    }
  }
  else if (Endian == 2) {
    sVar2 = 0xd;
    pcVar1 = "DW_END_little";
  }
  else if (Endian == 0x40) {
    sVar2 = 0xe;
    pcVar1 = "DW_END_lo_user";
  }
  else if (Endian == 0xff) {
    sVar2 = 0xe;
    pcVar1 = "DW_END_hi_user";
  }
  SVar3.Length = sVar2;
  SVar3.Data = pcVar1;
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::EndianityString(unsigned Endian) {
  switch (Endian) {
  case DW_END_default:
    return "DW_END_default";
  case DW_END_big:
    return "DW_END_big";
  case DW_END_little:
    return "DW_END_little";
  case DW_END_lo_user:
    return "DW_END_lo_user";
  case DW_END_hi_user:
    return "DW_END_hi_user";
  }
  return StringRef();
}